

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.h
# Opt level: O0

void __thiscall xLearn::Model::~Model(Model *this)

{
  Model *in_RDI;
  
  free_model(in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->loss_func_);
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

~Model() { free_model(); }